

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbMfs.c
# Opt level: O1

word Acb_ComputeFunction(sat_solver *pSat,int PivotVar,int FreeVar,Vec_Int_t *vDivVars,int fCompl)

{
  uint uVar1;
  int iVar2;
  uint uVar3;
  Vec_Int_t *p;
  int *piVar4;
  ulong uVar5;
  long lVar6;
  ulong uVar7;
  lit *begin;
  long lVar8;
  uint uVar9;
  int pLits [2];
  int local_40;
  uint local_3c;
  ulong local_38;
  
  p = (Vec_Int_t *)malloc(0x10);
  p->nCap = 100;
  p->nSize = 0;
  piVar4 = (int *)malloc(400);
  p->pArray = piVar4;
  iVar2 = sat_solver_nvars(pSat);
  if (iVar2 <= FreeVar) {
    __assert_fail("FreeVar < sat_solver_nvars(pSat)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                  ,0x161,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
  }
  if (((PivotVar < 0) || (1 < (uint)fCompl)) || (local_40 = fCompl + PivotVar * 2, FreeVar < 0)) {
    __assert_fail("Var >= 0 && !(c >> 1)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                  ,0x12e,"int Abc_Var2Lit(int, int)");
  }
  local_3c = FreeVar * 2;
  local_38 = 0;
  do {
    iVar2 = sat_solver_solve(pSat,&local_40,(lit *)&local_38,0,0,0,0);
    uVar3 = local_3c;
    if (iVar2 != 1) {
      if (iVar2 != -1) {
        __assert_fail("status == l_True",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                      ,0x170,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)");
      }
      begin = p->pArray;
      break;
    }
    if ((int)local_3c < 0) {
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x131,"int Abc_LitNot(int)");
    }
    if (p->nCap < 1) {
      if (p->pArray == (int *)0x0) {
        piVar4 = (int *)malloc(4);
      }
      else {
        piVar4 = (int *)realloc(p->pArray,4);
      }
      p->pArray = piVar4;
      if (piVar4 == (int *)0x0) {
        __assert_fail("p->pArray",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
      }
      p->nCap = 1;
    }
    *p->pArray = uVar3 ^ 1;
    p->nSize = 1;
    uVar3 = vDivVars->nSize;
    if (0 < (int)uVar3) {
      lVar6 = 0;
      do {
        iVar2 = vDivVars->pArray[lVar6];
        if (((long)iVar2 < 0) || (pSat->size <= iVar2)) {
          __assert_fail("v >= 0 && v < s->size",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bsat/satSolver.h"
                        ,0xdf,"int sat_solver_var_literal(sat_solver *, int)");
        }
        Vec_IntPush(p,(uint)(pSat->model[iVar2] != 1) + iVar2 * 2 ^ 1);
        lVar6 = lVar6 + 1;
        uVar3 = vDivVars->nSize;
      } while (lVar6 < (int)uVar3);
    }
    lVar6 = (long)p->nSize;
    uVar5 = 0xffffffffffffffff;
    if (1 < lVar6) {
      lVar8 = 1;
      do {
        uVar1 = p->pArray[lVar8];
        if ((int)uVar1 < 0) {
          __assert_fail("Lit >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                        ,0x12f,"int Abc_Lit2Var(int)");
        }
        uVar9 = 0xffffffff;
        if (0 < (int)uVar3) {
          uVar7 = 0;
          do {
            if (vDivVars->pArray[uVar7] == uVar1 >> 1) {
              uVar9 = (uint)uVar7;
              break;
            }
            uVar7 = uVar7 + 1;
          } while (uVar3 != uVar7);
        }
        if ((int)uVar9 < 0) {
          __assert_fail("iVar >= 0",
                        "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/base/acb/acbMfs.c"
                        ,0x18d,"word Acb_ComputeFunction(sat_solver *, int, int, Vec_Int_t *, int)")
          ;
        }
        uVar5 = uVar5 & ((ulong)(uVar1 & 1) - 1 ^ s_Truths6[uVar9]);
        lVar8 = lVar8 + 1;
      } while (lVar8 != lVar6);
    }
    local_38 = local_38 | uVar5;
    begin = p->pArray;
    iVar2 = sat_solver_addclause(pSat,begin,begin + lVar6);
  } while (iVar2 != 0);
  if (begin != (lit *)0x0) {
    free(begin);
    p->pArray = (int *)0x0;
  }
  free(p);
  return local_38;
}

Assistant:

word Acb_ComputeFunction( sat_solver * pSat, int PivotVar, int FreeVar, Vec_Int_t * vDivVars, int fCompl )
{
    int fExpand = 0;
    word uCube, uTruth = 0;
    Vec_Int_t * vTempLits = Vec_IntAlloc( 100 );
    int status, i, iVar, iLit, nFinal, * pFinal, pLits[2];
    assert( FreeVar < sat_solver_nvars(pSat) );
//    if ( fCompl )
//        pLits[0] = Abc_Var2Lit( sat_solver_nvars(pSat)-2, 0 ); // F = 1
//    else
        pLits[0] = Abc_Var2Lit( PivotVar, fCompl ); // F = 1
    pLits[1] = Abc_Var2Lit( FreeVar, 0 );  // iNewLit
    while ( 1 ) 
    {
        // find onset minterm
        status = sat_solver_solve( pSat, pLits, pLits + 2, 0, 0, 0, 0 );
        if ( status == l_False )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
        assert( status == l_True );
        if ( fExpand )
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[0]) ); // F = 0
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, sat_solver_var_literal(pSat, iVar) );
            // check against offset
            status = sat_solver_solve( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits), 0, 0, 0, 0 );
            if ( status != l_False )
                printf( "Failed internal check during function comptutation.\n" );
            assert( status == l_False );
            // compute cube and add clause
            nFinal = sat_solver_final( pSat, &pFinal );
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) ); // NOT(iNewLit)
            for ( i = 0; i < nFinal; i++ )
                if ( pFinal[i] != pLits[0] )
                    Vec_IntPush( vTempLits, pFinal[i] );
        }
        else
        {
            // collect divisor literals
            Vec_IntFill( vTempLits, 1, Abc_LitNot(pLits[1]) );// NOT(iNewLit)
            Vec_IntForEachEntry( vDivVars, iVar, i )
                Vec_IntPush( vTempLits, Abc_LitNot(sat_solver_var_literal(pSat, iVar)) );
        }
        uCube = ~(word)0;
        Vec_IntForEachEntryStart( vTempLits, iLit, i, 1 )
        {
            iVar = Vec_IntFind( vDivVars, Abc_Lit2Var(iLit) );   assert( iVar >= 0 );
            uCube &= Abc_LitIsCompl(iLit) ? s_Truths6[iVar] : ~s_Truths6[iVar];
        }
        uTruth |= uCube;
        status = sat_solver_addclause( pSat, Vec_IntArray(vTempLits), Vec_IntLimit(vTempLits) );
        if ( status == 0 )
        {
            Vec_IntFree( vTempLits );
            return uTruth;
        }
    }
    Vec_IntFree( vTempLits );
    assert( 0 ); 
    return ~(word)0;
}